

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O2

void __thiscall
VBitmap::VBitmap(VBitmap *this,uint8_t *data,size_t width,size_t height,size_t bytesPerLine,
                Format format)

{
  undefined7 in_register_00000089;
  Format local_39;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  uint8_t *local_20;
  model *local_18;
  
  (this->mImpl).mModel = (model *)0x0;
  if ((int)CONCAT71(in_register_00000089,format) != 0 &&
      ((bytesPerLine != 0 && height != 0) && (width != 0 && data != (uint8_t *)0x0))) {
    local_39 = format;
    local_38 = bytesPerLine;
    local_30 = height;
    local_28 = width;
    local_20 = data;
    vshared_ptr<VBitmap::Impl,unsigned_long>::
    vshared_ptr<unsigned_char*&,unsigned_long&,unsigned_long&,unsigned_long&,VBitmap::Format&>
              ((vshared_ptr<VBitmap::Impl,unsigned_long> *)&local_18,&local_20,&local_28,&local_30,
               &local_38,&local_39);
    vshared_ptr<VBitmap::Impl,_unsigned_long>::unref(&this->mImpl);
    (this->mImpl).mModel = local_18;
    local_18 = (model *)0x0;
    vshared_ptr<VBitmap::Impl,_unsigned_long>::unref
              ((vshared_ptr<VBitmap::Impl,_unsigned_long> *)&local_18);
  }
  return;
}

Assistant:

VBitmap::VBitmap(uint8_t *data, size_t width, size_t height,
                 size_t bytesPerLine, VBitmap::Format format)
{
    if (!data || width <= 0 || height <= 0 || bytesPerLine <= 0 ||
        format == Format::Invalid)
        return;

    mImpl = rc_ptr<Impl>(data, width, height, bytesPerLine, format);
}